

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

FlagBase * __thiscall args::Command::Match(Command *this,EitherFlag *flag)

{
  _Invoker_type p_Var1;
  Base *this_00;
  pointer ppBVar2;
  bool bVar3;
  Options OVar4;
  int iVar5;
  uint uVar6;
  reference ppBVar7;
  undefined4 extraout_var;
  undefined8 in_RSI;
  Group *in_RDI;
  FlagBase *res_1;
  Base *child;
  const_iterator __end3;
  const_iterator __begin3;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range3;
  FlagBase *res;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  in_stack_ffffffffffffffd0;
  Group *in_stack_ffffffffffffffd8;
  FlagBase *local_8;
  
  if (in_RDI[2].validator._M_invoker == (_Invoker_type)0x0) {
    if (in_RDI[3].children.super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      uVar6 = (*(in_RDI->super_Base)._vptr_Base[2])();
      if ((uVar6 & 1) == 0) {
        local_8 = (FlagBase *)0x0;
      }
      else {
        local_8 = Group::Match(in_stack_ffffffffffffffd8,
                               (EitherFlag *)in_stack_ffffffffffffffd0._M_current);
      }
    }
    else {
      ppBVar2 = in_RDI[3].children.super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_8 = (FlagBase *)(**(code **)&(*ppBVar2)[1].options)(ppBVar2,in_RSI);
    }
  }
  else {
    p_Var1 = in_RDI[2].validator._M_invoker;
    local_8 = (FlagBase *)(**(code **)(*(long *)p_Var1 + 0x38))(p_Var1,in_RSI);
    if (local_8 == (FlagBase *)0x0) {
      Group::Children(in_RDI);
      std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin(in_stack_ffffffffffffffa8);
      std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(in_stack_ffffffffffffffa8);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                                 *)in_RDI,
                                (__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                                 *)in_stack_ffffffffffffffa8), bVar3) {
        ppBVar7 = __gnu_cxx::
                  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                  ::operator*((__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                               *)&stack0xffffffffffffffd0);
        this_00 = *ppBVar7;
        OVar4 = Base::GetOptions(this_00);
        OVar4 = operator&(OVar4,Global);
        if (OVar4 != None) {
          iVar5 = (*this_00->_vptr_Base[7])(this_00,in_RSI);
          if ((FlagBase *)CONCAT44(extraout_var,iVar5) != (FlagBase *)0x0) {
            return (FlagBase *)CONCAT44(extraout_var,iVar5);
          }
        }
        __gnu_cxx::
        __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
        ::operator++((__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                      *)&stack0xffffffffffffffd0);
      }
      local_8 = (FlagBase *)0x0;
    }
  }
  return local_8;
}

Assistant:

virtual FlagBase *Match(const EitherFlag &flag) override
            {
                if (selectedCommand != nullptr)
                {
                    if (auto *res = selectedCommand->Match(flag))
                    {
                        return res;
                    }

                    for (auto *child: Children())
                    {
                        if ((child->GetOptions() & Options::Global) != Options::None)
                        {
                            if (auto *res = child->Match(flag))
                            {
                                return res;
                            }
                        }
                    }

                    return nullptr;
                }

                if (subparser != nullptr)
                {
                    return subparser->Match(flag);
                }

                return Matched() ? Group::Match(flag) : nullptr;
            }